

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadLinearExpr<TestNLHandler2::LinearConHandler>(void *param_1,uint param_2)

{
  int iVar1;
  double dVar2;
  double coef;
  int var_index;
  int i;
  int local_18;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2> *this;
  LinearConHandler local_1;
  
  this = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2> *)
         param_1;
  for (local_18 = 0; local_18 < (int)param_2; local_18 = local_18 + 1) {
    iVar1 = ReadUInt(this,param_2);
    dVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                      ((BinaryReader<mp::internal::EndiannessConverter> *)param_1);
    BinaryReaderBase::ReadTillEndOfLine
              ((BinaryReaderBase *)
               (((BinaryReader<mp::internal::EndiannessConverter> *)param_1)->super_BinaryReaderBase
               ).super_ReaderBase.ptr_);
    TestNLHandler2::LinearConHandler::AddTerm(&local_1,iVar1,dVar2);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}